

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_train.cc
# Opt level: O1

int main(int argc,char **argv)

{
  vw *vw;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"--hash all -q st --noconstant -f train.w --quiet --csoaa_ldf m",""
            );
  vw = VW::initialize(&local_30,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  run(vw);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ezexample_train finish",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  VW::finish(vw,true);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{ // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE -- THIS WILL STORE A MODEL TO train.ezw
  vw* vw = VW::initialize("--hash all -q st --noconstant -f train.w --quiet --csoaa_ldf m");

  run(vw);

  // AND FINISH UP
  cerr << "ezexample_train finish"<<endl;
  VW::finish(*vw);
}